

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::plot_implicit(Plotter *this,size_t funcid)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  _Bit_reference *this_00;
  size_type sVar6;
  int iVar7;
  size_type in_RSI;
  long in_RDI;
  double dVar8;
  type *ptVar9;
  reference rVar10;
  reference rVar11;
  size_t i_1;
  size_t i;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  type worker;
  atomic<int> sqr_id;
  int sgn_zup;
  double zup;
  int sgn_zleft;
  double zleft;
  bool interest_from_above;
  bool interest_from_left;
  int sgn_z;
  bool interesting_square;
  double z;
  int xy_pos;
  double precise_y;
  double precise_x;
  double coarse_x;
  int cxi;
  int csx;
  double cy;
  int cyi;
  int csy;
  vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
  interest_squares;
  bool coarse_right_interesting;
  vector<bool,_std::allocator<bool>_> coarse_below_interesting;
  vector<double,_std::allocator<double>_> coarse_line;
  color ineq_color;
  value_type *func;
  value_type *in_stack_fffffffffffffd58;
  allocator_type *in_stack_fffffffffffffd60;
  size_type sVar12;
  type *in_stack_fffffffffffffd68;
  allocator_type *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd80;
  uint local_26c;
  _Bit_type in_stack_fffffffffffffd98;
  _Bit_type *in_stack_fffffffffffffda0;
  uint local_244;
  size_type local_1f0;
  ulong local_1e8;
  vector<std::thread,_std::allocator<std::thread>_> local_1e0;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  reference local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 local_194 [4];
  int local_190;
  int local_18c;
  allocator_type local_188 [28];
  uint local_16c;
  double local_168;
  reference local_160;
  uint local_14c;
  double local_148;
  reference local_140;
  reference local_130;
  byte local_11a;
  byte local_119;
  uint in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef8;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *pvVar13;
  undefined1 fill;
  double dVar14;
  value_type vVar15;
  int iVar16;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *pvVar17;
  vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *draw_buf;
  int local_d8;
  int local_d4;
  unsigned_long local_d0;
  ulong local_c8;
  undefined1 local_c0 [30];
  byte local_a2;
  vector<double,_std::allocator<double>_> local_60;
  undefined1 local_48 [48];
  reference local_18;
  undefined1 local_10 [16];
  
  local_18 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                       ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                        (in_RDI + 0x40),in_RSI);
  bVar1 = Expr::is_null((Expr *)in_stack_fffffffffffffd70);
  if ((!bVar1) &&
     ((pvVar3 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                operator[](&(local_18->expr).ast,0), pvVar3->opcode != 1 || (local_18->type != 0x10)
      ))) {
    anon_unknown_1::get_ineq_color((color *)in_stack_fffffffffffffd68);
    std::allocator<double>::allocator((allocator<double> *)0x180dee);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70);
    std::allocator<double>::~allocator((allocator<double> *)0x180e1a);
    std::allocator<bool>::allocator((allocator<bool> *)0x180e47);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffd70,
               (size_type)in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::allocator<bool>::~allocator((allocator<bool> *)0x180e73);
    local_a2 = 0;
    std::
    vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ::vector((vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
              *)0x180e88);
    if ((plot_implicit(unsigned_long)::HIGH_PIX_LIMIT == '\0') &&
       (iVar2 = __cxa_guard_acquire(&plot_implicit(unsigned_long)::HIGH_PIX_LIMIT), iVar2 != 0)) {
      local_c8 = 200000 / (ulong)(anonymous_namespace)::NUM_THREADS;
      local_d0 = 20000;
      puVar4 = std::max<unsigned_long>(&local_c8,&local_d0);
      plot_implicit::HIGH_PIX_LIMIT = *puVar4;
      __cxa_guard_release(&plot_implicit(unsigned_long)::HIGH_PIX_LIMIT);
    }
    rVar10._M_mask = in_stack_fffffffffffffd98;
    rVar10._M_p = in_stack_fffffffffffffda0;
    for (local_d4 = -1; local_d4 < *(int *)(in_RDI + 0xc) + 3; local_d4 = local_d4 + 4) {
      local_d8 = 4;
      if (*(int *)(in_RDI + 0xc) <= local_d4) {
        local_d4 = *(int *)(in_RDI + 0xc) + -1;
        local_d8 = (*(int *)(in_RDI + 0xc) + -1) % 4;
        if (local_d8 == 0) break;
      }
      local_a2 = 0;
      pvVar17 = (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
                (((double)(*(int *)(in_RDI + 0xc) - local_d4) * 1.0 *
                 (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) /
                 (double)*(int *)(in_RDI + 0xc) + *(double *)(in_RDI + 0x28));
      for (iVar2 = -1; iVar2 < *(int *)(in_RDI + 8) + 3; iVar2 = iVar2 + 4) {
        iVar16 = 4;
        if (*(int *)(in_RDI + 8) <= iVar2) {
          iVar2 = *(int *)(in_RDI + 8) + -1;
          iVar16 = (*(int *)(in_RDI + 8) + -1) % 4;
          if (iVar16 == 0) break;
        }
        dVar8 = ((double)iVar2 * (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) /
                (double)*(int *)(in_RDI + 8) + *(double *)(in_RDI + 0x18);
        iVar7 = local_d4 * *(int *)(in_RDI + 8) + iVar2;
        pvVar13 = pvVar17;
        dVar14 = dVar8;
        draw_buf = pvVar17;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (ulong)*(uint *)(in_RDI + 0x314));
        fill = (undefined1)((ulong)pvVar13 >> 0x38);
        *pvVar5 = (value_type)pvVar17;
        vVar15 = dVar14;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (ulong)*(uint *)(in_RDI + 0x310));
        *pvVar5 = dVar14;
        ptVar9 = (type *)Expr::operator()((Expr *)rVar10._M_p,(Environment *)rVar10._M_mask);
        if ((iVar16 + -1 <= iVar2) && (local_d8 + -1 <= local_d4)) {
          in_stack_fffffffffffffeec = in_stack_fffffffffffffeec & 0xffffff;
          if (0.0 <= (double)ptVar9) {
            local_244 = (uint)((double)ptVar9 != 0.0);
          }
          else {
            local_244 = 0xffffffff;
          }
          local_119 = local_a2 & 1;
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffd80,
                              CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          local_130 = rVar10;
          local_11a = std::_Bit_reference::operator_cast_to_bool(&local_130);
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffd80,
                              CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          local_140 = rVar10;
          this_00 = std::_Bit_reference::operator=(&local_140,false);
          local_a2 = std::_Bit_reference::operator_cast_to_bool(this_00);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_60,(long)((iVar2 + 1) - iVar16));
          local_148 = *pvVar5;
          if (0.0 <= local_148) {
            local_26c = (uint)(local_148 != 0.0);
          }
          else {
            local_26c = 0xffffffff;
          }
          local_14c = local_26c;
          if ((int)(local_26c * local_244) < 1) {
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffd80,
                                CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
            in_stack_fffffffffffffd80 = (vector<bool,_std::allocator<bool>_> *)rVar11._M_mask;
            local_160 = rVar11;
            std::_Bit_reference::operator=(&local_160,true);
            in_stack_fffffffffffffeec = CONCAT13(1,(int3)in_stack_fffffffffffffeec);
          }
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_60,(long)(iVar2 + 1));
          local_168 = *pvVar5;
          if (0.0 <= local_168) {
            in_stack_fffffffffffffd7c = (uint)(local_168 != 0.0);
          }
          else {
            in_stack_fffffffffffffd7c = 0xffffffff;
          }
          if ((int)(in_stack_fffffffffffffd7c * local_244) < 1) {
            local_a2 = 1;
            in_stack_fffffffffffffeec = CONCAT13(1,(int3)in_stack_fffffffffffffeec);
          }
          local_16c = in_stack_fffffffffffffd7c;
          if ((((in_stack_fffffffffffffeec & 0x1000000) == 0) && ((local_119 & 1) == 0)) &&
             ((local_11a & 1) == 0)) {
            if ((-1 < (int)local_244) && (local_18->type != 0x10)) {
              anon_unknown_1::buf_add_screen_rectangle
                        (draw_buf,(View *)CONCAT44(iVar2,iVar16),(float)((ulong)vVar15 >> 0x20),
                         SUB84(vVar15,0),(float)((ulong)dVar8 >> 0x20),SUB84(dVar8,0),(bool)fill,
                         (color *)CONCAT44(iVar7,in_stack_fffffffffffffef8),
                         (float)((ulong)ptVar9 >> 0x20),
                         CONCAT44(in_stack_fffffffffffffeec,local_244));
            }
          }
          else {
            local_18c = local_d4 - local_d8;
            local_190 = iVar2 - iVar16;
            in_stack_fffffffffffffd70 = local_188;
            std::tuple<int,_int,_int,_int,_double>::
            tuple<int,_int_&,_int,_int_&,_double_&,_true,_true>
                      ((tuple<int,_int,_int,_int,_double> *)in_stack_fffffffffffffd80,
                       (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       (int *)in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68,
                       (int *)in_stack_fffffffffffffd60,(double *)in_stack_fffffffffffffd58);
            std::
            vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
            ::push_back((vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
                         *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          }
        }
        in_stack_fffffffffffffd68 = ptVar9;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_60,(long)(iVar2 + 1));
        *pvVar5 = (value_type)in_stack_fffffffffffffd68;
        pvVar17 = draw_buf;
      }
    }
    memset(local_194,0,4);
    local_1c0 = local_194;
    local_1b8 = local_c0;
    local_1b0 = local_18;
    local_1a8 = local_10;
    local_1a0 = local_48;
    if ((anonymous_namespace)::NUM_THREADS < 2) {
      std::
      tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/sxyu[P]nivalis/src/plotter/render.cpp:640:19)>_>
      ::type::operator()((type *)coarse_below_interesting.super__Bvector_base<std::allocator<bool>_>
                                 ._M_impl.super__Bvector_impl_data._M_finish.
                                 super__Bit_iterator_base._8_8_);
    }
    else {
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)0x181705);
      for (local_1e8 = 0; local_1e8 < (anonymous_namespace)::NUM_THREADS; local_1e8 = local_1e8 + 1)
      {
        std::vector<std::thread,std::allocator<std::thread>>::
        emplace_back<nivalis::Plotter::plot_implicit(unsigned_long)::__0&>
                  ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
      }
      local_1f0 = 0;
      while( true ) {
        sVar12 = local_1f0;
        sVar6 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_1e0);
        if (sVar6 <= sVar12) break;
        std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_1e0,local_1f0);
        std::thread::join();
        local_1f0 = local_1f0 + 1;
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffd70);
    }
    std::
    vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
    ::~vector((vector<std::tuple<int,_int,_int,_int,_double>,_std::allocator<std::tuple<int,_int,_int,_int,_double>_>_>
               *)in_stack_fffffffffffffd70);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x18180a);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70);
  }
  return;
}

Assistant:

void Plotter::plot_implicit(size_t funcid) {
    auto& func = funcs[funcid];
    // Implicit function
    if (func.expr.is_null() ||
            (func.expr.ast[0].opcode == OpCode::val &&
             func.type == Function::FUNC_TYPE_IMPLICIT)) {
        // Either 0=0 or c=0 for some c, do not draw
        return;
    }

    // Inequality color
    color::color ineq_color = get_ineq_color(func.line_color);

    // Coarse interval
    static const int COARSE_INTERVAL = 4;

    // Function values in above line
    std::vector<double> coarse_line(view.swid + 2);

    // 'Interesting' squares from above line/to left
    // When a square is painted, need to paint neighbor
    // to below (if changes sign left)/
    // right (if changes sign above) as well
    std::vector<bool> coarse_below_interesting(view.swid + 2);
    bool coarse_right_interesting = false;

    // Interesting squares
    using Square = std::tuple<int, int, int, int, double>;
    std::vector<Square> interest_squares;

    // Increase interval per x pixels
    static const size_t HIGH_PIX_LIMIT =
        std::max<size_t>(200000 / NUM_THREADS, 20000);
    // Maximum number of pixels to draw (stops drawing)
    static const size_t MAX_PIXELS = 300000;
    // Epsilon for bisection
    static const double BISECTION_EPS = 1e-4;

    for (int csy = -1; csy < view.shigh + COARSE_INTERVAL - 1; csy += COARSE_INTERVAL) {
        int cyi = COARSE_INTERVAL;
        if (csy >= view.shigh) {
            csy = view.shigh - 1;
            cyi = (view.shigh-1) % COARSE_INTERVAL;
            if (cyi == 0) break;
        }
        const double cy = _SY_TO_Y(csy);
        coarse_right_interesting = false;
        for (int csx = -1; csx < view.swid + COARSE_INTERVAL - 1; csx += COARSE_INTERVAL) {
            int cxi = COARSE_INTERVAL;
            if (csx >= view.swid) {
                csx = view.swid - 1;
                cxi = (view.swid-1) % COARSE_INTERVAL;
                if (cxi == 0) break;
            }
            // Update interval based on point count
            const double coarse_x = _SX_TO_X(csx);
            double precise_x = coarse_x, precise_y = cy;
            const int xy_pos = csy * view.swid + csx;

            env.vars[y_var] = cy;
            env.vars[x_var] = coarse_x;
            double z = func.expr(env);
            if (csx >= cxi-1 && csy >= cyi-1) {
                bool interesting_square = false;
                int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                bool interest_from_left = coarse_right_interesting;
                bool interest_from_above = coarse_below_interesting[csx+1];
                coarse_right_interesting = coarse_below_interesting[csx+1] = false;
                double zleft = coarse_line[csx+1 - cxi];
                int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                if (sgn_zleft * sgn_z <= 0) {
                    coarse_below_interesting[csx+1] = true;
                    interesting_square = true;
                }
                double zup = coarse_line[csx+1];
                int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                if (sgn_zup * sgn_z <= 0) {
                    coarse_right_interesting = true;
                    interesting_square = true;
                }
                if (interesting_square || interest_from_left ||
                        interest_from_above) {
                    interest_squares.push_back(Square(
                                csy - cyi, csy, csx - cxi, csx, z));
                } else if (sgn_z >= 0 &&
                        func.type !=
                        Function::FUNC_TYPE_IMPLICIT) {
                    // Inequality region
                    buf_add_screen_rectangle(draw_buf, view,
                            csx + (float)(- cxi + 1),
                            csy + (float)(- cyi + 1),
                            (float)cxi, (float)cyi,
                            true, ineq_color, 0.0, funcid);
                }
            }
            coarse_line[csx+1] = z;
        }
    }

#ifndef NIVALIS_EMSCRIPTEN
    std::atomic<int> sqr_id(0);
#else
    int sqr_id(0);
#endif
    auto worker = [&]() {
        std::vector<double> line(view.swid + 2);
        std::vector<bool> fine_paint_below(view.swid + 2);
        std::vector<std::array<int, 3> > tdraws, tdraws_ineq;
        std::vector<PointMarker> tpt_markers;
        Environment tenv = env;
        bool fine_paint_right;
        // Number of pixels drawn, used to increase fine interval
        size_t tpix_cnt = 0;
        // Fine interval (variable)
        int fine_interval = 1;
        while (true) {
            int i = sqr_id++;
            if (i >= interest_squares.size()) break;
            auto& sqr = interest_squares[i];

            if (tpix_cnt > MAX_PIXELS) break;
            // Update interval based on point count
            fine_interval = static_cast<int>(tpix_cnt /
                    HIGH_PIX_LIMIT) + 1;
            if (fine_interval >= 3) fine_interval = 4;

            int ylo, yhi, xlo, xhi; double z_at_xy_hi;
            std::tie(ylo, yhi, xlo, xhi, z_at_xy_hi) = sqr;

            std::fill(fine_paint_below.begin() + (xlo + 1),
                    fine_paint_below.begin() + (xhi + 2), false);
            for (int sy = ylo; sy <= yhi; sy += fine_interval) {
                fine_paint_right = false;
                const double y = _SY_TO_Y(sy);
                for (int sx = xlo; sx <= xhi; sx += fine_interval) {

                    const double x = _SX_TO_X(sx);
                    double z;
                    if (sy == yhi && sx == xhi) {
                        z = z_at_xy_hi;
                    } else {
                        tenv.vars[y_var] = y;
                        tenv.vars[x_var] = x;
                        z = func.expr(tenv);
                    }
                    if (sy > ylo && sx > xlo) {
                        int sgn_z = (z < 0 ? -1 : z == 0 ? 0 : 1);
                        bool paint_square = false;
                        bool paint_from_left = fine_paint_right;
                        bool paint_from_above = fine_paint_below[sx+1];
                        fine_paint_right = fine_paint_below[sx+1] = false;
                        double zup = line[sx+1];
                        int sgn_zup = (zup < 0 ? -1 : zup == 0 ? 0 : 1);
                        if (sgn_zup * sgn_z <= 0) {
                            //     // Bisect up
                            //     tenv.vars[x_var] = x;
                            //     double lo = y;
                            //     double hi = (view.shigh - (sy - fine_interval))*1. / view.shigh * ydiff + view.ymin;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[y_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_z == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_y = lo;
                            paint_square = fine_paint_right = true;
                        }
                        double zleft = line[sx+1 - fine_interval];
                        int sgn_zleft = (zleft < 0 ? -1 : zleft == 0 ? 0 : 1);
                        if (sgn_zleft * sgn_z <= 0) {
                            // if (!paint_square) {
                            //     // Bisect left
                            //     tenv.vars[y_var] = y;
                            //     double lo = 1.*(sx - fine_interval) / view.swid * xdiff + view.xmin;
                            //     double hi = x;
                            //     while (hi - lo > BISECTION_EPS) {
                            //         double mi = (lo + hi) / 2;
                            //         tenv.vars[x_var] = mi;
                            //         double zmi = expr(tenv);
                            //         int sgn_zmi = (zmi < 0 ? -1 : 1);
                            //         if (sgn_zleft == sgn_zmi) lo = mi;
                            //         else hi = mi;
                            //     }
                            //     precise_x = lo;
                            // }
                            paint_square = fine_paint_below[sx+1] = true;
                        }
                        if (paint_square || paint_from_left || paint_from_above) {
                            // float precise_sy =
                            //     static_cast<float>(
                            //             (view.ymax - y) / ydiff * view.shigh);
                            // float precise_sx = static_cast<float>(
                            //         (x - view.xmin) / xdiff * view.swid);
                            tdraws.push_back({sx, sy, fine_interval});
                            ++tpix_cnt;
                        } else if (sgn_z >= 0 &&
                                func.type !=
                                Function::FUNC_TYPE_IMPLICIT) {
                            // Inequality region
                            tdraws_ineq.push_back({sx, sy, fine_interval});
                        }
                    }
                    line[sx+1] = z;
                }
            }
        }

        {
#ifndef NIVALIS_EMSCRIPTEN
            std::lock_guard<std::mutex> lock(mtx);
#endif
            if ((func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                // Draw function line (boundary)
                for (auto& p : tdraws) {
                    buf_add_screen_rectangle(draw_buf, view,
                            p[0] + (float)(- p[2] + 1),
                            p[1] + (float)(- p[2] + 1),
                            (float)(p[2]),
                            (float)(p[2]),
                            true, func.line_color, 0.0, funcid);
                }
            }
            for (auto& p : tdraws_ineq) {
                // Draw inequality region
                buf_add_screen_rectangle(draw_buf, view,
                        p[0] + (float)(- p[2] + 1),
                        p[1] + (float)(- p[2] + 1),
                        (float)p[2],
                        (float)p[2],
                        true,
                        ineq_color, 0.0, funcid);
            }

            size_t sz = pt_markers.size();
            pt_markers.resize(sz + tpt_markers.size());
            std::move(tpt_markers.begin(), tpt_markers.end(),
                    pt_markers.begin() + sz);

            // Show detail lost warning
            if (fine_interval > 1) loss_detail = true;
        }
    };

#ifndef NIVALIS_EMSCRIPTEN
    if (NUM_THREADS <= 1) {
        worker();
    } else {
        std::vector<std::thread> pool;
        for (size_t i = 0; i < NUM_THREADS; ++i) {
            pool.emplace_back(worker);
        }
        for (size_t i = 0; i < pool.size(); ++i) pool[i].join();
    }
#else
    worker();
#endif
}